

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockCallTest_unexpectedScopeCallHappened_Test::testBody
          (TEST_MockCallTest_unexpectedScopeCallHappened_Test *this)

{
  UtestShell *test;
  MockSupport *pMVar1;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest emptyExpectations;
  MockUnexpectedCallHappenedFailure expectedFailure;
  MockFailureReporterInstaller local_a1;
  SimpleString local_a0;
  MockExpectedCallsList local_90;
  SimpleString local_80;
  TestFailure local_70;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_a1);
  MockExpectedCallsList::MockExpectedCallsList(&local_90);
  local_90._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aaff0;
  test = mockFailureTest();
  SimpleString::SimpleString(&local_a0,"scope::func");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)&local_70,test,&local_a0,&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"scope");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"func");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_80);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_a0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x8a);
  TestFailure::~TestFailure(&local_70);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_90);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_a1);
  return;
}

Assistant:

TEST(MockCallTest, unexpectedScopeCallHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest emptyExpectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "scope::func", emptyExpectations);

    mock("scope").actualCall("func");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}